

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O2

void Llb_ManPrintHisto(Llb_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  void *pvVar3;
  uint i;
  
  for (i = 0; p_00 = p->pAig->vObjs, (int)i < p_00->nSize; i = i + 1) {
    pvVar3 = Vec_PtrEntry(p_00,i);
    if (pvVar3 != (void *)0x0) {
      iVar1 = Vec_IntEntry(p->vObj2Var,i);
      if (-1 < iVar1) {
        iVar1 = 0;
        printf("%3d :",(ulong)i);
        while( true ) {
          iVar2 = Vec_IntEntry(p->vVarBegs,i);
          if (iVar2 <= iVar1) break;
          putchar(0x20);
          iVar1 = iVar1 + 1;
        }
        while( true ) {
          iVar2 = Vec_IntEntry(p->vVarEnds,i);
          if (iVar2 < iVar1) break;
          iVar2 = Llb_ManGroupHasVar(p,iVar1,i);
          putchar((uint)(iVar2 == 0) * 3 + 0x2a);
          iVar1 = iVar1 + 1;
        }
        putchar(10);
      }
    }
  }
  return;
}

Assistant:

void Llb_ManPrintHisto( Llb_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, k;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( Vec_IntEntry(p->vObj2Var, i) < 0 )
            continue;
        printf( "%3d :", i );
        for ( k = 0; k < Vec_IntEntry(p->vVarBegs, i); k++ )
            printf( " " );
        for (      ; k <= Vec_IntEntry(p->vVarEnds, i); k++ )
            printf( "%c", Llb_ManGroupHasVar(p, k, i)? '*':'-' );
        printf( "\n" );
    }
}